

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O0

t_object * __thiscall
xemmai::t_heap<xemmai::t_object>::t_of<3UL,_1024UL>::f_grow
          (t_of<3UL,_1024UL> *this,t_heap<xemmai::t_object> *a_heap)

{
  mutex_type *pmVar1;
  lock_guard<std::mutex> local_80;
  lock_guard<std::mutex> lock;
  t_object *q;
  t_object *q_1;
  size_t i;
  char *p;
  char *block;
  unsigned_long length;
  size_t size;
  t_heap<xemmai::t_object> *a_heap_local;
  t_of<3UL,_1024UL> *this_local;
  undefined8 local_28;
  undefined4 local_1c;
  undefined8 local_18;
  atomic_size_t *local_10;
  
  length = 0x400;
  block = (char *)&Elf64_Ehdr_00100000;
  size = (size_t)a_heap;
  a_heap_local = (t_heap<xemmai::t_object> *)this;
  pmVar1 = (mutex_type *)f_map(0x100000);
  i = (size_t)pmVar1;
  for (q_1 = (t_object *)0x1; q_1 < (t_object *)0x400; q_1 = (t_object *)((long)&q_1->v_next + 1)) {
    t_object::t_object((t_object *)i);
    *(unsigned_long *)i = length + i;
    *(undefined8 *)(i + 0x30) = 3;
    i = length + i;
  }
  t_object::t_object((t_object *)i);
  *(undefined8 *)(i + 0x30) = 3;
  pmVar1[1].super___mutex_base._M_mutex.__align = 0x400;
  lock._M_device = pmVar1;
  std::lock_guard<std::mutex>::lock_guard(&local_80,(mutex_type *)(size + 0x38));
  std::
  map<xemmai::t_object*,unsigned_long,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,unsigned_long>>>
  ::emplace<xemmai::t_object*&,unsigned_long&>
            ((map<xemmai::t_object*,unsigned_long,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,unsigned_long>>>
              *)(size + 8),(t_object **)&lock,(unsigned_long *)&block);
  std::lock_guard<std::mutex>::~lock_guard(&local_80);
  local_10 = &this->v_grown;
  local_18 = 0x400;
  local_1c = 0;
  local_28 = 0x400;
  LOCK();
  this_local = (t_of<3UL,_1024UL> *)(local_10->super___atomic_base<unsigned_long>)._M_i;
  (local_10->super___atomic_base<unsigned_long>)._M_i =
       (local_10->super___atomic_base<unsigned_long>)._M_i + 0x400;
  UNLOCK();
  (**(code **)size)();
  return (t_object *)lock._M_device;
}

Assistant:

T* f_grow(t_heap& a_heap)
		{
			auto size = c_UNIT << A_rank;
			auto length = size * A_size;
			auto block = static_cast<char*>(f_map(length));
			auto p = block;
			for (size_t i = 1; i < A_size; ++i) {
				auto q = new(p) T;
				q->v_next = reinterpret_cast<T*>(p += size);
				q->v_rank = A_rank;
			}
			auto q = new(p) T;
			q->v_rank = A_rank;
			q = reinterpret_cast<T*>(block);
			q->v_cyclic = A_size;
			{
				std::lock_guard lock(a_heap.v_mutex);
				a_heap.v_blocks.emplace(q, length);
			}
			v_grown.fetch_add(A_size, std::memory_order_relaxed);
			a_heap.v_tick();
			return q;
		}